

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  char *text;
  float _x;
  float fVar6;
  ImVec2 IVar7;
  float local_e4;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  ImRect total_bb;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect value_bb;
  ImVec2 pos;
  ImVec2 label_size;
  ImVec2 value_size;
  char *value_text_end;
  char *value_text_begin;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  char *label_local;
  
  pIVar5 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    _x = CalcItemWidth();
    text = pIVar2->TempBuffer;
    iVar4 = ImFormatStringV(pIVar2->TempBuffer,0xc01,fmt,args);
    label_size = CalcTextSize(text,text + iVar4,false,-1.0);
    IVar7 = CalcTextSize(label,(char *)0x0,true,-1.0);
    value_bb.Max = (pIVar5->DC).CursorPos;
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + label_size.y);
    local_80 = ::operator+(&value_bb.Max,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_78,&value_bb.Max,&local_80);
    pos.x = IVar7.x;
    if (pos.x <= 0.0) {
      local_e4 = 0.0;
    }
    else {
      local_e4 = (pIVar2->Style).ItemInnerSpacing.x + pos.x;
    }
    pos.y = IVar7.y;
    fVar6 = ImMax<float>(label_size.y,pos.y);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&local_a8,_x + local_e4,fVar1 + fVar1 + fVar6);
    local_a0 = ::operator+(&value_bb.Max,&local_a8);
    ImRect::ImRect((ImRect *)local_98,&value_bb.Max,&local_a0);
    ItemSize((ImRect *)local_98,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_98,0,(ImRect *)0x0,0);
    if (bVar3) {
      local_b0 = ::operator+((ImVec2 *)local_78,&(pIVar2->Style).FramePadding);
      ImVec2::ImVec2(&local_b8,0.0,0.0);
      RenderTextClipped(&local_b0,&value_bb.Min,text,text + iVar4,&label_size,&local_b8,
                        (ImRect *)0x0);
      if (0.0 < pos.x) {
        ImVec2::ImVec2(&local_c0,value_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                       (float)local_78._4_4_ + (pIVar2->Style).FramePadding.y);
        RenderText(local_c0,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const char* value_text_begin = &g.TempBuffer[0];
    const char* value_text_end = value_text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 value_size = CalcTextSize(value_text_begin, value_text_end, false);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImVec2 pos = window->DC.CursorPos;
    const ImRect value_bb(pos, pos + ImVec2(w, value_size.y + style.FramePadding.y * 2));
    const ImRect total_bb(pos, pos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), ImMax(value_size.y, label_size.y) + style.FramePadding.y * 2));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    RenderTextClipped(value_bb.Min + style.FramePadding, value_bb.Max, value_text_begin, value_text_end, &value_size, ImVec2(0.0f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}